

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::log_internal::LogMessage::LogMessageData::FinalizeEncodingAndFormat
          (LogMessageData *this)

{
  array<char,_15000UL> *paVar1;
  LogSeverity severity;
  uint tid;
  int line;
  Duration timestamp;
  bool bVar2;
  Span<char> *pSVar3;
  size_t sVar4;
  log_internal *plVar5;
  Span<char> *in_RCX;
  Span<char> SVar6;
  string_view sVar7;
  Span<char> string_remaining;
  ProtoField local_a0;
  Span<const_char> encoded_data;
  Span<const_char> local_68;
  ProtoField field;
  
  pSVar3 = encoded_remaining(this);
  encoded_data.len_ = (long)pSVar3->ptr_ - (long)&this->encoded_buf;
  paVar1 = &this->string_buf;
  string_remaining.len_ = 15000;
  string_remaining.ptr_ = paVar1->_M_elems;
  encoded_data.ptr_ = (this->encoded_buf)._M_elems;
  Span<char>::remove_suffix(&string_remaining,2);
  if ((this->entry).prefix_ == true) {
    severity = (this->entry).severity_;
    timestamp = (this->entry).timestamp_.rep_;
    tid = (this->entry).tid_;
    sVar7 = (this->entry).base_filename_;
    line = (this->entry).line_;
    bVar2 = ThreadIsLoggingToLogSink();
    in_RCX = (Span<char> *)(ulong)tid;
    sVar4 = FormatLogPrefix(severity,(Time)timestamp,tid,sVar7,line,(uint)bVar2,&string_remaining);
  }
  else {
    sVar4 = 0;
  }
  (this->entry).prefix_len_ = sVar4;
  field.data_.ptr_ = (pointer)0x0;
  field.data_.len_ = 0;
  do {
    do {
      do {
        bVar2 = ProtoField::DecodeFrom(&field,&encoded_data);
        if (!bVar2) {
          (string_remaining.ptr_ + (0x3cd8 - (long)paVar1) + (long)&this->entry)[0] = '\n';
          (string_remaining.ptr_ + (0x3cd8 - (long)paVar1) + (long)&this->entry)[1] = '\0';
          local_a0.type_ = 15000;
          local_a0.tag_ = (uint64_t)paVar1;
          SVar6 = Span<char>::subspan((Span<char> *)&local_a0,0,
                                      (size_type)(string_remaining.ptr_ + (2 - (long)paVar1)));
          (this->entry).text_message_with_prefix_and_newline_and_nul_.ptr_ = SVar6.ptr_;
          (this->entry).text_message_with_prefix_and_newline_and_nul_.len_ = SVar6.len_;
          return;
        }
      } while ((field.tag_ != 7) || (field.type_ != kLengthDelimited));
      local_68.ptr_ = field.data_.ptr_;
      local_68.len_ = field.data_.len_;
    } while (string_remaining.len_ < 2);
    local_a0.data_.ptr_ = (pointer)0x0;
    local_a0.data_.len_ = 0;
    do {
      bVar2 = ProtoField::DecodeFrom(&local_a0,&local_68);
      if (!bVar2) break;
    } while ((((local_a0.tag_ != 6) && (local_a0.tag_ != 1)) || (local_a0.type_ != kLengthDelimited)
             ) || (sVar7._M_str = (char *)&string_remaining,
                  sVar7._M_len = (size_t)local_a0.data_.ptr_,
                  plVar5 = (log_internal *)
                           AppendTruncated((log_internal *)local_a0.data_.len_,sVar7,in_RCX),
                  local_a0.data_.len_ <= plVar5));
  } while( true );
}

Assistant:

void LogMessage::LogMessageData::FinalizeEncodingAndFormat() {
  // Note that `encoded_remaining()` may have zero size without pointing past
  // the end of `encoded_buf`, so the difference between `data()` pointers is
  // used to compute the size of `encoded_data`.
  absl::Span<const char> encoded_data(
      encoded_buf.data(),
      static_cast<size_t>(encoded_remaining().data() - encoded_buf.data()));
  // `string_remaining` is the suffix of `string_buf` that has not been filled
  // yet.
  absl::Span<char> string_remaining(string_buf);
  // We may need to write a newline and nul-terminator at the end of the decoded
  // string data.  Rather than worry about whether those should overwrite the
  // end of the string (if the buffer is full) or be appended, we avoid writing
  // into the last two bytes so we always have space to append.
  string_remaining.remove_suffix(2);
  entry.prefix_len_ =
      entry.prefix() ? log_internal::FormatLogPrefix(
                           entry.log_severity(), entry.timestamp(), entry.tid(),
                           entry.source_basename(), entry.source_line(),
                           log_internal::ThreadIsLoggingToLogSink()
                               ? PrefixFormat::kRaw
                               : PrefixFormat::kNotRaw,
                           string_remaining)
                     : 0;
  // Decode data from `encoded_buf` until we run out of data or we run out of
  // `string_remaining`.
  ProtoField field;
  while (field.DecodeFrom(&encoded_data)) {
    switch (field.tag()) {
      case EventTag::kValue:
        if (field.type() != WireType::kLengthDelimited) continue;
        if (PrintValue(string_remaining, field.bytes_value())) continue;
        break;
    }
  }
  auto chars_written =
      static_cast<size_t>(string_remaining.data() - string_buf.data());
    string_buf[chars_written++] = '\n';
  string_buf[chars_written++] = '\0';
  entry.text_message_with_prefix_and_newline_and_nul_ =
      absl::MakeSpan(string_buf).subspan(0, chars_written);
}